

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<4,_embree::TriangleMv<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::TriangleMv<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  FastAllocator *this_00;
  ThreadLocal *pTVar10;
  ThreadLocal2 *this_01;
  TriangleMesh *pTVar11;
  BuildPrim *pBVar12;
  long lVar13;
  char *pcVar14;
  MutexSys *pMVar15;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  undefined1 in_ZMM0 [64];
  undefined1 auVar31 [16];
  vuint4 vgeomID;
  Lock<embree::MutexSys> local_d8;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  Lock<embree::MutexSys> local_a8;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  value_type local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  vuint4 vprimID;
  
  auVar31 = in_ZMM0._0_16_;
  uVar5 = current->_begin;
  uVar6 = current->_end;
  this_00 = alloc->alloc;
  pTVar10 = alloc->talloc1;
  vgeomID.field_0.v[0] = 0xb0;
  this_01 = pTVar10->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_a8.locked = true;
    local_a8.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_d8.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_d8.locked = true;
    auVar31 = (undefined1  [16])0x0;
    local_78 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_78);
    Lock<embree::MutexSys>::~Lock(&local_d8);
    Lock<embree::MutexSys>::~Lock(&local_a8);
  }
  uVar23 = vgeomID.field_0.v[0];
  pTVar10->bytesUsed = pTVar10->bytesUsed + vgeomID.field_0.v[0];
  sVar26 = pTVar10->cur;
  uVar27 = (ulong)(-(int)sVar26 & 0xf);
  uVar24 = sVar26 + vgeomID.field_0.v[0] + uVar27;
  pTVar10->cur = uVar24;
  if (pTVar10->end < uVar24) {
    pTVar10->cur = sVar26;
    pMVar15 = (MutexSys *)pTVar10->allocBlockSize;
    if ((MutexSys *)(vgeomID.field_0.v[0] * 4) < pMVar15 ||
        (long)(vgeomID.field_0.v[0] * 4) - (long)pMVar15 == 0) {
      local_d8.mutex = pMVar15;
      pauVar25 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_d8);
      pTVar10->ptr = (char *)pauVar25;
      sVar26 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
      pTVar10->bytesWasted = sVar26;
      pTVar10->end = (size_t)local_d8.mutex;
      pTVar10->cur = uVar23;
      if (local_d8.mutex < (ulong)uVar23) {
        pTVar10->cur = 0;
        local_d8.mutex = (MutexSys *)pTVar10->allocBlockSize;
        pauVar25 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_d8);
        pTVar10->ptr = (char *)pauVar25;
        sVar26 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
        pTVar10->bytesWasted = sVar26;
        pTVar10->end = (size_t)local_d8.mutex;
        pTVar10->cur = uVar23;
        if (local_d8.mutex < (ulong)uVar23) {
          pTVar10->cur = 0;
          pauVar25 = (undefined1 (*) [16])0x0;
          goto LAB_00dfacc7;
        }
      }
      pTVar10->bytesWasted = sVar26;
    }
    else {
      pauVar25 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&vgeomID);
    }
  }
  else {
    pTVar10->bytesWasted = pTVar10->bytesWasted + uVar27;
    pauVar25 = (undefined1 (*) [16])(pTVar10->ptr + (uVar24 - vgeomID.field_0._0_8_));
  }
LAB_00dfacc7:
  vgeomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar31,auVar31);
  uStack_b8 = 0;
  uStack_b0 = 0;
  local_d8.mutex = (MutexSys *)0x0;
  local_d8.locked = false;
  local_d8._9_7_ = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  local_a8.mutex = (MutexSys *)0x0;
  local_a8.locked = false;
  local_a8._9_7_ = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_78 = (value_type)0x0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  pTVar11 = this->mesh;
  pBVar12 = this->morton;
  uVar7 = this->geomID_;
  auVar31._8_4_ = 0x7f800000;
  auVar31._0_8_ = 0x7f8000007f800000;
  auVar31._12_4_ = 0x7f800000;
  aVar30.m128[2] = -INFINITY;
  aVar30._0_8_ = 0xff800000ff800000;
  aVar30.m128[3] = -INFINITY;
  vprimID.field_0 = vgeomID.field_0;
  for (lVar28 = 0; (ulong)(uVar6 - uVar5) << 2 != lVar28; lVar28 = lVar28 + 4) {
    uVar8 = *(uint *)((long)&pBVar12[uVar5].field_0 + lVar28 * 2 + 4);
    lVar29 = (ulong)uVar8 * *(long *)&pTVar11->field_0x68;
    lVar13 = *(long *)&(pTVar11->super_Geometry).field_0x58;
    pcVar14 = (pTVar11->vertices0).super_RawBufferView.ptr_ofs;
    sVar26 = (pTVar11->vertices0).super_RawBufferView.stride;
    auVar2 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar13 + lVar29) * sVar26);
    auVar3 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar13 + 4 + lVar29) * sVar26);
    auVar4 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar13 + 8 + lVar29) * sVar26);
    auVar31 = vminps_avx(auVar31,auVar2);
    auVar18 = vminps_avx(auVar3,auVar4);
    auVar31 = vminps_avx(auVar31,auVar18);
    auVar18 = vmaxps_avx((undefined1  [16])aVar30,auVar2);
    auVar17 = vmaxps_avx(auVar3,auVar4);
    aVar30 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vmaxps_avx(auVar18,auVar17);
    *(int *)((long)&local_d8.mutex + lVar28) = auVar2._0_4_;
    uVar9 = vextractps_avx(auVar2,1);
    *(undefined4 *)((long)&uStack_c8 + lVar28) = uVar9;
    *(uint *)((long)&vgeomID.field_0 + lVar28) = uVar7;
    uVar9 = vextractps_avx(auVar2,2);
    *(undefined4 *)((long)&uStack_b8 + lVar28) = uVar9;
    *(int *)((long)&local_a8.mutex + lVar28) = auVar3._0_4_;
    uVar9 = vextractps_avx(auVar3,1);
    *(undefined4 *)((long)&uStack_98 + lVar28) = uVar9;
    *(uint *)((long)&vprimID.field_0 + lVar28) = uVar8;
    uVar9 = vextractps_avx(auVar3,2);
    *(undefined4 *)((long)&uStack_88 + lVar28) = uVar9;
    *(int *)((long)&local_78 + lVar28) = auVar4._0_4_;
    uVar9 = vextractps_avx(auVar4,1);
    *(undefined4 *)((long)&uStack_68 + lVar28) = uVar9;
    uVar9 = vextractps_avx(auVar4,2);
    *(undefined4 *)((long)&uStack_58 + lVar28) = uVar9;
  }
  auVar2[8] = local_d8.locked;
  auVar2._0_8_ = local_d8.mutex;
  auVar2._9_7_ = local_d8._9_7_;
  auVar3._8_8_ = uStack_c0;
  auVar3._0_8_ = uStack_c8;
  auVar4._8_8_ = uStack_b0;
  auVar4._0_8_ = uStack_b8;
  auVar18[8] = local_a8.locked;
  auVar18._0_8_ = local_a8.mutex;
  auVar18._9_7_ = local_a8._9_7_;
  auVar17._8_8_ = uStack_90;
  auVar17._0_8_ = uStack_98;
  auVar19._8_8_ = uStack_80;
  auVar19._0_8_ = uStack_88;
  auVar20._8_8_ = uStack_70;
  auVar20._0_8_ = local_78;
  auVar21._8_8_ = uStack_60;
  auVar21._0_8_ = uStack_68;
  auVar22._8_8_ = uStack_50;
  auVar22._0_8_ = uStack_58;
  auVar2 = vmovntps_avx(auVar2);
  *pauVar25 = auVar2;
  auVar2 = vmovntps_avx(auVar3);
  pauVar25[1] = auVar2;
  auVar2 = vmovntps_avx(auVar4);
  pauVar25[2] = auVar2;
  auVar2 = vmovntps_avx(auVar18);
  pauVar25[3] = auVar2;
  auVar2 = vmovntps_avx(auVar17);
  pauVar25[4] = auVar2;
  auVar2 = vmovntps_avx(auVar19);
  pauVar25[5] = auVar2;
  auVar2 = vmovntps_avx(auVar20);
  pauVar25[6] = auVar2;
  auVar2 = vmovntps_avx(auVar21);
  pauVar25[7] = auVar2;
  auVar2 = vmovntps_avx(auVar22);
  pauVar25[8] = auVar2;
  auVar2 = vmovntps_avx((undefined1  [16])vgeomID.field_0);
  pauVar25[9] = auVar2;
  auVar2 = vmovntps_avx((undefined1  [16])vprimID.field_0);
  pauVar25[10] = auVar2;
  aVar16 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
           vinsertps_avx(auVar31,ZEXT416(current->_end - current->_begin),0x30);
  (__return_storage_ptr__->ref).ptr = (ulong)pauVar25 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar16;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar30;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4v* accel = (Triangle4v*) alloc.malloc1(sizeof(Triangle4v),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);       
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero;
        const TriangleMesh* __restrict__ mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
        }
        Triangle4v::store_nt(accel,Triangle4v(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }